

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_draw_command * nk__draw_list_end(nk_draw_list *canvas,nk_buffer *buffer)

{
  nk_draw_command *end;
  nk_byte *memory;
  nk_size offset;
  nk_size size;
  nk_buffer *buffer_local;
  nk_draw_list *canvas_local;
  
  if (buffer == (nk_buffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x1e8f,
                  "const struct nk_draw_command *nk__draw_list_end(const struct nk_draw_list *, const struct nk_buffer *)"
                 );
  }
  if (canvas != (nk_draw_list *)0x0) {
    if ((buffer == (nk_buffer *)0x0) || (canvas == (nk_draw_list *)0x0)) {
      canvas_local = (nk_draw_list *)0x0;
    }
    else {
      canvas_local = (nk_draw_list *)
                     ((long)(buffer->memory).ptr +
                     (ulong)(canvas->cmd_count - 1) * -0x20 +
                     ((buffer->memory).size - canvas->cmd_offset));
    }
    return (nk_draw_command *)canvas_local;
  }
  __assert_fail("canvas",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x1e90,
                "const struct nk_draw_command *nk__draw_list_end(const struct nk_draw_list *, const struct nk_buffer *)"
               );
}

Assistant:

NK_API const struct nk_draw_command*
nk__draw_list_end(const struct nk_draw_list *canvas, const struct nk_buffer *buffer)
{
    nk_size size;
    nk_size offset;
    nk_byte *memory;
    const struct nk_draw_command *end;

    NK_ASSERT(buffer);
    NK_ASSERT(canvas);
    if (!buffer || !canvas)
        return 0;

    memory = (nk_byte*)buffer->memory.ptr;
    size = buffer->memory.size;
    offset = size - canvas->cmd_offset;
    end = nk_ptr_add(const struct nk_draw_command, memory, offset);
    end -= (canvas->cmd_count-1);
    return end;
}